

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateStringField
          (FieldGenerator *this,Printer *printer)

{
  byte bVar1;
  FieldDescriptor *pFVar2;
  Context *pCVar3;
  pointer pcVar4;
  Nonnull<const_char_*> pcVar5;
  undefined8 extraout_RAX;
  bool bVar6;
  long lVar7;
  string_view text;
  string_view text_00;
  JvmNameContext name_ctx;
  anon_class_1_0_00000001 local_2e9;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  undefined8 uStack_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  undefined8 uStack_2b0;
  Options *local_2a8;
  Printer *local_2a0;
  undefined1 local_298;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  long local_248;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  undefined8 uStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined2 local_1f8;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char local_1a8 [8];
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  Options **local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  Options **local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  pFVar2 = this->descriptor_;
  bVar1 = pFVar2->field_0x1;
  bVar6 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar6) {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar6,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((pFVar2->field_0x1 & 0x20) == 0) {
      pCVar3 = this->context_;
      local_2a8 = &pCVar3->options_;
      local_298 = this->lite_;
      pFVar2 = this->descriptor_;
      local_1f0[4] = (pCVar3->options_).opensource_runtime;
      local_1f0[5] = (pCVar3->options_).annotate_code;
      local_1f0[0] = (pCVar3->options_).generate_immutable_code;
      local_1f0[1] = (pCVar3->options_).generate_mutable_code;
      local_1f0[2] = (pCVar3->options_).generate_shared_code;
      local_1f0[3] = (pCVar3->options_).enforce_lite;
      pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
      local_2a0 = printer;
      local_1e8._M_p = (pointer)&local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar4,
                 pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
      pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
      local_1c8._M_p = (pointer)&local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar4,
                 pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
      local_1a8[0] = (pCVar3->options_).strip_nonfunctional_codegen;
      local_1a8[1] = (pCVar3->options_).jvm_dsl;
      java::WriteFieldDocComment(printer,pFVar2,(Options *)local_1f0,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
      }
      local_2c8 = &local_2b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"jvm_name_get","");
      local_1a0 = local_190;
      if (local_2c8 == &local_2b8) {
        uStack_188 = uStack_2b0;
      }
      else {
        local_1a0 = local_2c8;
      }
      local_198 = local_2c0;
      local_2c0 = 0;
      local_2b8 = 0;
      local_168 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_178 = 0;
      local_170 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_160 = 1;
      local_158 = local_148;
      local_150 = 0;
      local_148[0] = 0;
      local_138 = 0;
      local_2c8 = &local_2b8;
      local_180 = &local_2a8;
      std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x53a374);
      local_f0 = 0;
      local_2e8 = &local_2d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"jvm_name_set","");
      local_e8 = local_d8;
      if (local_2e8 == &local_2d8) {
        uStack_d0 = uStack_2d0;
      }
      else {
        local_e8 = local_2e8;
      }
      local_e0 = local_2e0;
      local_2e0 = 0;
      local_2d8 = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      uStack_c0 = 0;
      local_b8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      local_a8 = 1;
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      local_2e8 = &local_2d8;
      local_c8 = &local_2a8;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x53a374);
      local_38 = 0;
      io::Printer::Emit(printer,&local_1a0,2,0xc9);
      lVar7 = 0x170;
      do {
        if (local_1a8[lVar7] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     ((long)&local_1e8._M_p + lVar7));
        }
        if ((long *)(local_208._M_local_buf + lVar7 + 8) != *(long **)((long)&uStack_210 + lVar7)) {
          operator_delete(*(long **)((long)&uStack_210 + lVar7),
                          *(long *)(local_208._M_local_buf + lVar7 + 8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[*(byte *)((long)&local_218._M_p + lVar7)]._M_data)
                  (&local_2e9,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&local_238._M_p + lVar7));
        *(undefined1 *)((long)&local_218._M_p + lVar7) = 0xff;
        if ((long *)((long)&local_248 + lVar7) != *(long **)((long)&local_258 + lVar7)) {
          operator_delete(*(long **)((long)&local_258 + lVar7),
                          *(long *)((long)&local_248 + lVar7) + 1);
        }
        lVar7 = lVar7 + -0xb8;
      } while (lVar7 != 0);
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
      }
      pFVar2 = this->descriptor_;
      pCVar3 = this->context_;
      local_240[4] = (pCVar3->options_).opensource_runtime;
      local_240[5] = (pCVar3->options_).annotate_code;
      local_240[0] = (pCVar3->options_).generate_immutable_code;
      local_240[1] = (pCVar3->options_).generate_mutable_code;
      local_240[2] = (pCVar3->options_).generate_shared_code;
      local_240[3] = (pCVar3->options_).enforce_lite;
      pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
      local_238._M_p = (pointer)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar4,
                 pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
      pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
      local_218._M_p = (pointer)&local_208;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar4,
                 pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
      local_1f8._0_1_ = (pCVar3->options_).strip_nonfunctional_codegen;
      local_1f8._1_1_ = (pCVar3->options_).jvm_dsl;
      java::WriteFieldAccessorDocComment
                (printer,pFVar2,CLEARER,(Options *)local_240,false,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != &local_208) {
        operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
      }
      text._M_str = 
      "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
      ;
      text._M_len = 0x65;
      io::Printer::Print<>(printer,text);
      bVar6 = FieldDescriptor::has_presence(this->descriptor_);
      if (bVar6) {
        pFVar2 = this->descriptor_;
        pCVar3 = this->context_;
        local_290[4] = (pCVar3->options_).opensource_runtime;
        local_290[5] = (pCVar3->options_).annotate_code;
        local_290[0] = (pCVar3->options_).generate_immutable_code;
        local_290[1] = (pCVar3->options_).generate_mutable_code;
        local_290[2] = (pCVar3->options_).generate_shared_code;
        local_290[3] = (pCVar3->options_).enforce_lite;
        pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
        local_288._M_p = (pointer)&local_278;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,pcVar4,
                   pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
        pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
        local_268._M_p = (pointer)&local_258;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar4,
                   pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
        local_248._0_1_ = (pCVar3->options_).strip_nonfunctional_codegen;
        local_248._1_1_ = (pCVar3->options_).jvm_dsl;
        java::WriteFieldAccessorDocComment
                  (printer,pFVar2,HAZZER,(Options *)local_290,false,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_p != &local_258) {
          operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_p != &local_278) {
          operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
        }
        text_00._M_str =
             "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
        ;
        text_00._M_len = 0x78;
        io::Printer::Print<>(printer,text_00);
      }
      return;
    }
    GenerateRepeatedStringField(this,printer);
    return;
  }
  GenerateStringField();
  java::Options::~Options((Options *)local_290);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void FieldGenerator::GenerateStringField(io::Printer* printer) const {
  if (descriptor_->is_repeated()) {
    GenerateRepeatedStringField(printer);
    return;
  }
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: kotlin.String\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(), /* builder */ false,
                                 /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}